

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_cache_server.cpp
# Opt level: O1

void __thiscall cppcms::impl::thread_functional::operator()(thread_functional *this)

{
  booster::aio::io_service::run();
  return;
}

Assistant:

void operator()()
	{
		bool stop=false;
		try{
			while(!stop) {
				try {
					io->run();
					stop=true;
				}
				catch(cppcms::cppcms_error const &e) {
					// Not much to do...
					// Object will be destroyed automatically 
					// Because it does not resubmit itself
					BOOSTER_ERROR("cppcms_scale") << "Error:" << e.what() << booster::trace(e);
				}
			}
		}
		catch(std::exception const &e)
		{
			BOOSTER_ERROR("cppcms_scale") << "Fatal:" << e.what() << booster::trace(e);
		}
		catch(...){
			BOOSTER_ERROR("cppcms_scale") << "Unknown exception" << std::endl;
		}
	}